

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPTCPTransmitter::~RTPTCPTransmitter(RTPTCPTransmitter *this)

{
  _List_node_base *p_Var1;
  pointer puVar2;
  pointer pcVar3;
  pointer piVar4;
  _List_node_base *p_Var5;
  
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPTCPTransmitter_0013f648;
  Destroy(this);
  RTPAbortDescriptors::~RTPAbortDescriptors(&this->m_abortDesc);
  p_Var5 = (this->m_rawpacketlist).
           super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)&this->m_rawpacketlist) {
    p_Var1 = p_Var5->_M_next;
    operator_delete(p_Var5,0x18);
    p_Var5 = p_Var1;
  }
  puVar2 = (this->m_localHostname).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->m_localHostname).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pcVar3 = (this->m_tmpFlags).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)(this->m_tmpFlags).
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar3);
  }
  piVar4 = (this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)(this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>,_std::_Select1st<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
  ::~_Rb_tree(&(this->m_destSockets)._M_t);
  return;
}

Assistant:

RTPTCPTransmitter::~RTPTCPTransmitter()
{
	Destroy();
}